

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O2

int OpenFiles(Context *context)

{
  int __fd;
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  FILE *pFVar4;
  char *__format;
  char *__filename;
  
  __filename = context->current_input_path;
  context->fin = (FILE *)0x0;
  if (__filename == (char *)0x0) {
    pFVar4 = fdopen(0,"rb");
    context->fin = (FILE *)pFVar4;
  }
  else {
    pFVar1 = fopen(__filename,"rb");
    context->fin = (FILE *)pFVar1;
    pFVar4 = _stderr;
    if (pFVar1 == (FILE *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      __format = "failed to open input file [%s]: %s\n";
      goto LAB_001037e4;
    }
  }
  if (context->test_integrity != 0) {
    return 1;
  }
  __filename = context->current_output_path;
  context->fout = (FILE *)0x0;
  if (__filename == (char *)0x0) {
    pFVar4 = fdopen(1,"wb");
    context->fout = (FILE *)pFVar4;
    return 1;
  }
  __fd = open(__filename,(uint)(context->force_overwrite == 0) << 7 | 0x241,0x180);
  pFVar4 = _stderr;
  if (__fd < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(pFVar4,"failed to open output file [%s]: %s\n",__filename,pcVar3);
    return 0;
  }
  pFVar1 = fdopen(__fd,"wb");
  context->fout = (FILE *)pFVar1;
  pFVar4 = _stderr;
  if (pFVar1 != (FILE *)0x0) {
    return 1;
  }
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  __format = "failed to open output file [%s]: %s\n";
LAB_001037e4:
  fprintf(pFVar4,__format,__filename,pcVar3);
  return 0;
}

Assistant:

static BROTLI_BOOL OpenFiles(Context* context) {
  BROTLI_BOOL is_ok = OpenInputFile(context->current_input_path, &context->fin);
  if (!context->test_integrity && is_ok) {
    is_ok = OpenOutputFile(
        context->current_output_path, &context->fout, context->force_overwrite);
  }
  return is_ok;
}